

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerImpl::PanIdQuery
          (Error *__return_storage_ptr__,CommissionerImpl *this,uint32_t param_1,uint16_t param_2,
          string *param_3)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view fmt;
  anon_class_1_0_00000001 local_fa;
  v10 local_f9;
  v10 *local_f8;
  size_t local_f0;
  string local_e8;
  string *local_c8;
  string *param_3_local;
  uint16_t param_2_local;
  CommissionerImpl *pCStack_b8;
  uint32_t param_1_local;
  CommissionerImpl *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 **local_60;
  v10 *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  v10 *local_18;
  v10 **local_10;
  
  local_c8 = param_3;
  param_3_local._2_2_ = param_2;
  param_3_local._4_4_ = param_1;
  pCStack_b8 = this;
  this_local = (CommissionerImpl *)__return_storage_ptr__;
  PanIdQuery::anon_class_1_0_00000001::operator()(&local_fa);
  local_10 = &local_f8;
  local_18 = &local_f9;
  bVar1 = ::fmt::v10::operator()(local_18);
  local_f0 = bVar1.size_;
  local_f8 = (v10 *)bVar1.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_78 = local_f8;
  sStack_70 = local_f0;
  local_60 = &local_78;
  local_88 = local_f8;
  local_80 = local_f0;
  local_68 = &local_e8;
  local_58 = local_88;
  sStack_50 = local_80;
  local_a8[0] = ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_40 = local_98;
  local_48 = local_a8;
  local_28 = 0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_48;
  fmt.size_ = 0;
  fmt.data_ = (char *)local_80;
  local_38 = local_48;
  local_30 = local_48;
  local_20 = local_40;
  ::fmt::v10::vformat_abi_cxx11_(&local_e8,local_88,fmt,args);
  Error::Error(__return_storage_ptr__,kUnimplemented,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Error PanIdQuery(uint32_t, uint16_t, const std::string &) override { return ERROR_UNIMPLEMENTED(""); }